

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O0

_Bool BinarySource_data_avail(BinarySource *src,size_t wanted)

{
  size_t wanted_local;
  BinarySource *src_local;
  
  if (src->err == BSE_NO_ERROR) {
    if (src->len - src->pos < wanted) {
      src->err = BSE_OUT_OF_DATA;
      src_local._7_1_ = false;
    }
    else {
      src_local._7_1_ = true;
    }
  }
  else {
    src_local._7_1_ = false;
  }
  return src_local._7_1_;
}

Assistant:

static bool BinarySource_data_avail(BinarySource *src, size_t wanted)
{
    if (src->err)
        return false;

    if (wanted <= src->len - src->pos)
        return true;

    src->err = BSE_OUT_OF_DATA;
    return false;
}